

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

string * __thiscall
Json::Value::toStyledString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  char *__s;
  Value *root;
  string local_80;
  allocator<char> local_4a;
  undefined1 local_49;
  undefined1 local_48 [8];
  StreamWriterBuilder builder;
  Value *this_local;
  string *out;
  
  builder.settings_.limit_ = (ptrdiff_t)this;
  StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_48);
  local_49 = 0;
  bVar1 = hasComment(this,commentBefore);
  root = (Value *)0x7e9929;
  __s = "";
  if (bVar1) {
    __s = "\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_4a)
  ;
  std::allocator<char>::~allocator(&local_4a);
  writeString_abi_cxx11_(&local_80,(Json *)local_48,(Factory *)this,root);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  local_49 = 1;
  StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_48);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::toStyledString() const {
  StreamWriterBuilder builder;

  JSONCPP_STRING out = this->hasComment(commentBefore) ? "\n" : "";
  out += Json::writeString(builder, *this);
  out += "\n";

  return out;
}